

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void phmap::priv::(anonymous_namespace)::
     BtreeAllocatorTest<phmap::btree_set<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>>>
               (void)

{
  bool bVar1;
  pointer p;
  char *pcVar2;
  AssertHelper local_468;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_13;
  long local_430;
  int local_424;
  int i_2;
  Message local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_12;
  Message local_3f8;
  int local_3ec;
  size_type local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_11;
  Message local_3c8;
  int local_3bc;
  size_type local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_10;
  Message local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_9;
  long local_368;
  int64_t local_360;
  int64_t original_bytes1_2;
  key_compare local_349;
  undefined1 local_348 [8];
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  b2_2;
  key_compare local_319;
  undefined1 local_318 [8];
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  b1_2;
  Message local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_8;
  long local_2c0;
  int local_2b4;
  int i_1;
  Message local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_7;
  Message local_288;
  int local_27c;
  size_type local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_6;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_5;
  long local_228;
  int64_t local_220;
  int64_t original_bytes1_1;
  key_compare local_209;
  undefined1 local_208 [8];
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  b2_1;
  key_compare local_1d9;
  undefined1 local_1d8 [8];
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  b1_1;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_4;
  long local_180;
  int local_174;
  int i;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  Message local_148;
  int local_13c;
  size_type local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  Message local_118;
  int local_10c;
  size_type local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  long local_b8;
  int64_t local_b0;
  int64_t original_bytes1;
  key_compare local_99;
  undefined1 local_98 [8];
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  b2;
  key_compare local_69;
  undefined1 local_68 [8];
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  b1;
  pointer unused2;
  pointer unused1;
  Generator<long> generator;
  CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  local_28;
  PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  allocator1;
  int64_t bytes2;
  int64_t bytes1;
  
  bytes2 = 0;
  allocator1.
  super_CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  .bytes_used_ = (CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
                  )(int64_t *)0x0;
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::CountingAllocator(&allocator2,&bytes2);
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::CountingAllocator((PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
                       *)&local_28,(int64_t *)&allocator1);
  Generator<long>::Generator((Generator<long> *)&unused1,1000);
  p = CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
      ::allocate(&allocator2.
                  super_CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
                 ,1,(const_pointer)0x0);
  b1.
  super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
  .tree_.size_ = (size_type)
                 CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
                 ::allocate(&local_28,1,(const_pointer)0x0);
  PropagatingCountingAlloc<long>::
  CountingAllocator<phmap::btree_set<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>>>
            ((PropagatingCountingAlloc<long> *)
             &b2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .tree_.size_,
             &allocator2.
              super_CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
            );
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::btree_container((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                     *)local_68,&local_69,
                    (allocator_type *)
                    &b2.
                     super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                     .tree_.size_);
  anon_unknown_0::PropagatingCountingAlloc<long>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<long> *)
             &b2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .tree_.size_);
  PropagatingCountingAlloc<long>::
  CountingAllocator<phmap::btree_set<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>>>
            ((PropagatingCountingAlloc<long> *)&original_bytes1,&local_28);
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::btree_container((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                     *)local_98,&local_99,(allocator_type *)&original_bytes1);
  anon_unknown_0::PropagatingCountingAlloc<long>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<long> *)&original_bytes1);
  local_b0 = bytes2;
  local_b8 = Generator<long>::operator()((Generator<long> *)&unused1,0);
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
            *)&gtest_ar.message_,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
            *)local_68,&local_b8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e0,"bytes1","original_bytes1",&bytes2,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::operator=((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
               *)local_68,
              (btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
               *)local_98);
  local_108 = btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                      *)local_68);
  local_10c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_100,"b1.size()","0",&local_108,&local_10c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_138 = btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                      *)local_98);
  local_13c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_130,"b2.size()","0",&local_138,&local_13c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_160,"bytes1","original_bytes1",&bytes2,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe90,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe90);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  for (local_174 = 1; local_174 < 1000; local_174 = local_174 + 1) {
    local_180 = Generator<long>::operator()((Generator<long> *)&unused1,local_174);
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
              *)&gtest_ar_4.message_,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              *)local_68,&local_180);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_1a8,"bytes2","bytes1",(long *)&allocator1,&bytes2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &b1_1.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .tree_.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &b1_1.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .tree_.size_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &b1_1.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .tree_.size_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::~btree_set((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                *)local_98);
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::~btree_set((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                *)local_68);
  PropagatingCountingAlloc<long>::
  CountingAllocator<phmap::btree_set<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>>>
            ((PropagatingCountingAlloc<long> *)
             &b2_1.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .tree_.size_,
             &allocator2.
              super_CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
            );
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::btree_container((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                     *)local_1d8,&local_1d9,
                    (allocator_type *)
                    &b2_1.
                     super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                     .tree_.size_);
  anon_unknown_0::PropagatingCountingAlloc<long>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<long> *)
             &b2_1.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .tree_.size_);
  PropagatingCountingAlloc<long>::
  CountingAllocator<phmap::btree_set<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>>>
            ((PropagatingCountingAlloc<long> *)&original_bytes1_1,&local_28);
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::btree_container((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                     *)local_208,&local_209,(allocator_type *)&original_bytes1_1);
  anon_unknown_0::PropagatingCountingAlloc<long>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<long> *)&original_bytes1_1);
  local_220 = bytes2;
  local_228 = Generator<long>::operator()((Generator<long> *)&unused1,0);
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
            *)&gtest_ar_5.message_,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
            *)local_1d8,&local_228);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_250,"bytes1","original_bytes1",&bytes2,&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::operator=((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
               *)local_1d8,
              (btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
               *)local_208);
  local_278 = btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                      *)local_1d8);
  local_27c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_270,"b1.size()","0",&local_278,&local_27c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_2a0,"bytes1","original_bytes1",&bytes2,&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffd50,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd50);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  for (local_2b4 = 1; local_2b4 < 1000; local_2b4 = local_2b4 + 1) {
    local_2c0 = Generator<long>::operator()((Generator<long> *)&unused1,local_2b4);
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
              *)&gtest_ar_8.message_,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              *)local_1d8,&local_2c0);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_2e8,"bytes2","bytes1",(long *)&allocator1,&bytes2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &b1_2.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .tree_.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &b1_2.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .tree_.size_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &b1_2.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                .tree_.size_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::~btree_set((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                *)local_208);
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::~btree_set((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                *)local_1d8);
  PropagatingCountingAlloc<long>::
  CountingAllocator<phmap::btree_set<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>>>
            ((PropagatingCountingAlloc<long> *)
             &b2_2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .tree_.size_,
             &allocator2.
              super_CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
            );
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::btree_container((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                     *)local_318,&local_319,
                    (allocator_type *)
                    &b2_2.
                     super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                     .tree_.size_);
  anon_unknown_0::PropagatingCountingAlloc<long>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<long> *)
             &b2_2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              .tree_.size_);
  PropagatingCountingAlloc<long>::
  CountingAllocator<phmap::btree_set<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>>>
            ((PropagatingCountingAlloc<long> *)&original_bytes1_2,&local_28);
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::btree_container((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                     *)local_348,&local_349,(allocator_type *)&original_bytes1_2);
  anon_unknown_0::PropagatingCountingAlloc<long>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<long> *)&original_bytes1_2);
  local_360 = bytes2;
  local_368 = Generator<long>::operator()((Generator<long> *)&unused1,0);
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
            *)&gtest_ar_9.message_,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
            *)local_318,&local_368);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_390,"bytes1","original_bytes1",&bytes2,&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  swap<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>>
            ((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
              *)local_318,
             (btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
              *)local_348);
  local_3b8 = btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                      *)local_318);
  local_3bc = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3b0,"b1.size()","0",&local_3b8,&local_3bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  local_3e8 = btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                      *)local_348);
  local_3ec = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3e0,"b2.size()","1",&local_3e8,&local_3ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_410,"bytes1","original_bytes1",&bytes2,&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbe0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffbe0,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbe0);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  for (local_424 = 1; local_424 < 1000; local_424 = local_424 + 1) {
    local_430 = Generator<long>::operator()((Generator<long> *)&unused1,local_424);
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
              *)&gtest_ar_13.message_,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              *)local_318,&local_430);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_458,"bytes2","bytes1",(long *)&allocator1,&bytes2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::~btree_set((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                *)local_348);
  btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
  ::~btree_set((btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>
                *)local_318);
  CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::deallocate(&allocator2.
                super_CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
               ,p,1);
  CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::deallocate(&local_28,
               (pointer)b1.
                        super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                        .
                        super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
                        .tree_.size_,1);
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
              *)&local_28);
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::~PropagatingCountingAlloc(&allocator2);
  return;
}

Assistant:

void BtreeAllocatorTest() {
        using value_type = typename T::value_type;

        int64_t bytes1 = 0, bytes2 = 0;
        PropagatingCountingAlloc<T> allocator1(&bytes1);
        PropagatingCountingAlloc<T> allocator2(&bytes2);
        Generator<value_type> generator(1000);

        // Test that we allocate properly aligned memory. If we don't, then Layout
        // will assert fail.
        auto unused1 = allocator1.allocate(1);
        auto unused2 = allocator2.allocate(1);

        // Test copy assignment
        {
            T b1(typename T::key_compare(), allocator1);
            T b2(typename T::key_compare(), allocator2);

            int64_t original_bytes1 = bytes1;
            b1.insert(generator(0));
            EXPECT_GT(bytes1, original_bytes1);

            // This should propagate the allocator.
            b1 = b2;
            EXPECT_EQ(b1.size(), 0);
            EXPECT_EQ(b2.size(), 0);
            EXPECT_EQ(bytes1, original_bytes1);

            for (int i = 1; i < 1000; i++) {
                b1.insert(generator(i));
            }

            // We should have allocated out of allocator2.
            EXPECT_GT(bytes2, bytes1);
        }

        // Test move assignment
        {
            T b1(typename T::key_compare(), allocator1);
            T b2(typename T::key_compare(), allocator2);

            int64_t original_bytes1 = bytes1;
            b1.insert(generator(0));
            EXPECT_GT(bytes1, original_bytes1);

            // This should propagate the allocator.
            b1 = std::move(b2);
            EXPECT_EQ(b1.size(), 0);
            EXPECT_EQ(bytes1, original_bytes1);

            for (int i = 1; i < 1000; i++) {
                b1.insert(generator(i));
            }

            // We should have allocated out of allocator2.
            EXPECT_GT(bytes2, bytes1);
        }

        // Test swap
        {
            T b1(typename T::key_compare(), allocator1);
            T b2(typename T::key_compare(), allocator2);

            int64_t original_bytes1 = bytes1;
            b1.insert(generator(0));
            EXPECT_GT(bytes1, original_bytes1);

            // This should swap the allocators.
            swap(b1, b2);
            EXPECT_EQ(b1.size(), 0);
            EXPECT_EQ(b2.size(), 1);
            EXPECT_GT(bytes1, original_bytes1);

            for (int i = 1; i < 1000; i++) {
                b1.insert(generator(i));
            }

            // We should have allocated out of allocator2.
            EXPECT_GT(bytes2, bytes1);
        }

        allocator1.deallocate(unused1, 1);
        allocator2.deallocate(unused2, 1);
    }